

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O1

bool __thiscall
helics::PublicationInfo::addSubscriber
          (PublicationInfo *this,GlobalHandle newSubscriber,string_view subscriberName)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  bool bVar4;
  GlobalHandle local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = subscriberName._M_str;
  local_18._M_len = subscriberName._M_len;
  pSVar1 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = pSVar1 == pSVar2;
  if (!bVar4) {
    if (((pSVar1->id).fed_id.gid != newSubscriber.fed_id.gid.gid) ||
       ((pSVar1->id).handle.hid != newSubscriber.handle.hid.hid)) {
      pSVar1 = pSVar1 + 1;
      do {
        pSVar3 = pSVar1;
        bVar4 = pSVar3 == pSVar2;
        if (bVar4) goto LAB_002d2c46;
        pSVar1 = pSVar3 + 1;
      } while (((pSVar3->id).fed_id.gid != newSubscriber.fed_id.gid.gid) ||
              ((pSVar3->id).handle.hid != newSubscriber.handle.hid.hid));
    }
    if (bVar4 == false) {
      return false;
    }
  }
LAB_002d2c46:
  local_20 = newSubscriber;
  std::vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>>::
  emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<helics::SubscriberInformation,std::allocator<helics::SubscriberInformation>> *)
             &this->subscribers,&local_20,&local_18);
  return bVar4;
}

Assistant:

bool PublicationInfo::addSubscriber(GlobalHandle newSubscriber, std::string_view subscriberName)
{
    for (auto& sub : subscribers) {
        if (sub.id == newSubscriber) {
            return false;
        }
    }
    subscribers.emplace_back(newSubscriber, subscriberName);
    return true;
}